

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# register_allocation.h
# Opt level: O0

size_t __thiscall
mocker::detail::InterferenceGraph::NodePairHash::operator()(NodePairHash *this,NodePair *nodePair)

{
  element_type *peVar1;
  string *psVar2;
  size_t sVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_19;
  NodePair *local_18;
  NodePair *nodePair_local;
  NodePairHash *this_local;
  
  local_18 = nodePair;
  nodePair_local = (NodePair *)this;
  peVar1 = std::
           __shared_ptr_access<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)nodePair);
  psVar2 = nasm::Register::getIdentifier_abi_cxx11_(peVar1);
  std::operator+(&local_60,psVar2,",");
  peVar1 = std::
           __shared_ptr_access<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&local_18->second);
  psVar2 = nasm::Register::getIdentifier_abi_cxx11_(peVar1);
  std::operator+(&local_40,&local_60,psVar2);
  sVar3 = std::
          hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
          operator()(&local_19,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  return sVar3;
}

Assistant:

std::size_t operator()(const NodePair &nodePair) const {
      return std::hash<std::string>{}(nodePair.first->getIdentifier() + "," +
                                      nodePair.second->getIdentifier());
    }